

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ConstTestT<unsigned_short>(void)

{
  if (ConstTestT<unsigned_short>()::t == '\0') {
    ConstTestT<unsigned_short>();
  }
  if (ConstTestT<unsigned_short>()::b == '\0') {
    ConstTestT<unsigned_short>();
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}